

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void Cmd_utid(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int local_28;
  int local_20;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    local_20 = 0;
  }
  else {
    pcVar3 = FCommandLine::operator[](argv,1);
    local_20 = atoi(pcVar3);
  }
  iVar1 = FCommandLine::argc(argv);
  if (2 < iVar1) {
    pcVar3 = FCommandLine::operator[](argv,2);
    iVar1 = atoi(pcVar3);
    if (-1 < iVar1) {
      pcVar3 = FCommandLine::operator[](argv,2);
      local_28 = atoi(pcVar3);
      goto LAB_005ad0a4;
    }
  }
  local_28 = 0;
LAB_005ad0a4:
  uVar2 = P_FindUniqueTID(local_20,local_28);
  Printf("%d\n",(ulong)uVar2);
  return;
}

Assistant:

CCMD(utid)
{
	Printf("%d\n",
		P_FindUniqueTID(argv.argc() > 1 ? atoi(argv[1]) : 0,
		(argv.argc() > 2 && atoi(argv[2]) >= 0) ? atoi(argv[2]) : 0));
}